

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O0

void oonf_subsystem_extract_name(oonf_subsystem_namebuf *pluginname,char *libname)

{
  int iVar1;
  char *pcVar2;
  oonf_libdata *poVar3;
  size_t sVar4;
  size_t sVar5;
  bool bVar6;
  char *ptr;
  size_t end;
  size_t start;
  char *libname_local;
  oonf_subsystem_namebuf *pluginname_local;
  size_t p_len;
  size_t s_len;
  
  memset(pluginname,0,0x20);
  end = 0;
  ptr = (char *)strlen(libname);
  pcVar2 = strrchr(libname,0x2f);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strrchr(libname,0x5c);
    if (pcVar2 != (char *)0x0) {
      end = (long)pcVar2 - (long)libname;
    }
  }
  else {
    end = (long)pcVar2 - (long)libname;
  }
  poVar3 = oonf_log_get_libdata();
  pcVar2 = poVar3->sharedlibrary_prefix;
  sVar4 = strlen(pcVar2);
  iVar1 = strncasecmp(libname + end,pcVar2,sVar4);
  if (iVar1 == 0) {
    poVar3 = oonf_log_get_libdata();
    sVar4 = strlen(poVar3->sharedlibrary_prefix);
    end = sVar4 + end;
  }
  poVar3 = oonf_log_get_libdata();
  pcVar2 = poVar3->sharedlibrary_postfix;
  sVar4 = strlen(libname + end);
  sVar5 = strlen(pcVar2);
  bVar6 = false;
  if (sVar5 < sVar4) {
    iVar1 = strcasecmp(libname + end + (sVar4 - sVar5),pcVar2);
    bVar6 = iVar1 == 0;
  }
  if (bVar6) {
    poVar3 = oonf_log_get_libdata();
    sVar4 = strlen(poVar3->sharedlibrary_prefix);
    ptr = ptr + -sVar4;
  }
  if (ptr + (1 - end) < (char *)0x21) {
    memcpy(pluginname,libname + end,(long)ptr - end);
  }
  return;
}

Assistant:

void
oonf_subsystem_extract_name(struct oonf_subsystem_namebuf *pluginname, const char *libname) {
  size_t start, end;
  char *ptr;

  memset(pluginname, 0, sizeof(*pluginname));

  start = 0;
  end = strlen(libname);

  /* remove path */
  if ((ptr = strrchr(libname, '/')) != NULL) {
    start += (ptr - libname);
  }
  else if ((ptr = strrchr(libname, '\\')) != NULL) {
    start += (ptr - libname);
  }

  /* remove (oonf/app) lib prefix */
  if (str_startswith_nocase(&libname[start], oonf_log_get_libdata()->sharedlibrary_prefix)) {
    start += strlen(oonf_log_get_libdata()->sharedlibrary_prefix);
  }

  /* remove (oonf/app) lib postfix */
  if (str_endswith_nocase(&libname[start], oonf_log_get_libdata()->sharedlibrary_postfix)) {
    end -= strlen(oonf_log_get_libdata()->sharedlibrary_prefix);
  }

  if (end - start + 1 <= sizeof(*pluginname)) {
    memcpy(pluginname->name, &libname[start], end - start);
  }
}